

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O2

bool __thiscall clipp::parser::operator()(parser *this,arg_string *arg)

{
  undefined4 uVar1;
  undefined4 uVar2;
  bool bVar3;
  
  uVar1 = this->index_;
  uVar2 = this->eaten_;
  this->index_ = uVar1 + 1;
  this->eaten_ = uVar2 + 1;
  if ((this->pos_).pos_.stack_.
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->pos_).pos_.stack_.
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    return false;
  }
  if ((this->blocked_ == false) && (bVar3 = try_match(this,arg), bVar3)) {
    return true;
  }
  bVar3 = try_match_blocked(this,arg);
  if (!bVar3) {
    if ((((this->blocked_ == false) &&
         (bVar3 = detail::scoped_dfs_traverser::matched(&this->pos_), !bVar3)) &&
        (bVar3 = group::child_t<clipp::parameter,_clipp::group>::required
                           ((this->pos_).pos_.stack_.
                            super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                            ._M_impl.super__Vector_impl_data._M_finish[-1].cur._M_current), bVar3))
       && (bVar3 = group::child_t<clipp::parameter,_clipp::group>::blocking
                             ((this->pos_).pos_.stack_.
                              super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                              ._M_impl.super__Vector_impl_data._M_finish[-1].cur._M_current), bVar3)
       ) {
      this->blocked_ = true;
    }
    add_nomatch(this,arg);
  }
  return false;
}

Assistant:

bool operator() (const arg_string& arg)
    {
        ++eaten_;
        ++index_;

        if(!valid()) return false;

        if(!blocked_ && try_match(arg)) return true;

        if(try_match_blocked(arg)) return false;

        //skipping of blocking & required patterns is not allowed
        if(!blocked_ && !pos_.matched() && pos_->required() && pos_->blocking()) {
            blocked_ = true;
        }

        add_nomatch(arg);
        return false;
    }